

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrc.cc
# Opt level: O1

void __thiscall
RRC::work(RRC *this,
         shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *qout)

{
  pointer pcVar1;
  SamplePublisher *this_00;
  pointer pcVar2;
  runtime_error *prVar3;
  int __fd;
  int *in_R9;
  pointer __src;
  const_iterator __cbeg;
  size_t nsamples;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  output;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_60;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_58;
  char local_4c [4];
  string local_48;
  
  __fd = (int)(qin->
              super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             local_68);
  if (local_68 == (undefined1  [8])0x0) {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,__fd);
  }
  else {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               local_70);
    nsamples = (long)*(pointer *)((long)local_68 + 8) - *(long *)local_68 >> 3;
    if (nsamples % (ulong)(long)this->decimation_ != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_4c[0] = -0x6d;
      local_4c[1] = '\0';
      local_4c[2] = '\0';
      local_4c[3] = '\0';
      util::str<char[53],char[93],char[2],int>
                (&local_48,(util *)"Assertion `(nsamples % decimation_) == 0` failed at ",
                 (char (*) [53])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesrecv/rrc.cc"
                 ,(char (*) [93])0x16a4a2,(char (*) [2])local_4c,in_R9);
      std::runtime_error::runtime_error(prVar3,(string *)&local_48);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70,
               nsamples / (ulong)(long)this->decimation_);
    std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::complex<float>*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>
              ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&this->tmp_,
               (this->tmp_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,*(long *)local_68,
               *(pointer *)((long)local_68 + 8));
    if ((long)(this->tmp_).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->tmp_).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 3 !=
        ((long)*(pointer *)((long)local_68 + 8) - *(long *)local_68 >> 3) + 0x1f) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_4c[0] = -0x6a;
      local_4c[1] = '\0';
      local_4c[2] = '\0';
      local_4c[3] = '\0';
      util::str<char[60],char[93],char[2],int>
                (&local_48,(util *)"Assertion `tmp_.size() == input->size() + NTAPS` failed at ",
                 (char (*) [60])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesrecv/rrc.cc"
                 ,(char (*) [93])0x16a4a2,(char (*) [2])local_4c,in_R9);
      std::runtime_error::runtime_error(prVar3,(string *)&local_48);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_58._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_68;
    local_68 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,&local_58);
    if (local_58._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)&local_58,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_58._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_58._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    work(this,nsamples,
         (this->tmp_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
         ._M_impl.super__Vector_impl_data._M_start,*(complex<float> **)local_70);
    pcVar2 = (this->tmp_).
             super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    __src = (this->tmp_).
            super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish + -0x1f;
    if (pcVar2 != __src) {
      memmove(pcVar2,__src,0xf8);
      pcVar1 = (this->tmp_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar2 = (pointer)(((long)pcVar1 - (long)__src) + (long)pcVar2);
      if (pcVar1 != pcVar2) {
        (this->tmp_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar2;
      }
    }
    if ((long)(this->tmp_).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->tmp_).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_start != 0xf8) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_4c[0] = -0x5e;
      local_4c[1] = '\0';
      local_4c[2] = '\0';
      local_4c[3] = '\0';
      util::str<char[44],char[93],char[2],int>
                (&local_48,(util *)"Assertion `tmp_.size() == NTAPS` failed at ",
                 (char (*) [44])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesrecv/rrc.cc"
                 ,(char (*) [93])0x16a4a2,(char (*) [2])local_4c,in_R9);
      std::runtime_error::runtime_error(prVar3,(string *)&local_48);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (this->samplePublisher_)._M_t.
              super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
              super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
              super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    if (this_00 != (SamplePublisher *)0x0) {
      SamplePublisher::publish(this_00,(Samples *)local_70);
    }
    local_60._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_70;
    local_70 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,&local_60);
    if (local_60._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)&local_60,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_60._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_60._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    if (local_70 != (undefined1  [8])0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)local_70,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
    }
  }
  if (local_68 != (undefined1  [8])0x0) {
    std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
    operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)local_68,
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_68);
  }
  return;
}

Assistant:

void RRC::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  auto nsamples = input->size();
  ASSERT((nsamples % decimation_) == 0);
  output->resize(nsamples / decimation_);
  tmp_.insert(tmp_.end(), input->begin(), input->end());
  ASSERT(tmp_.size() == input->size() + NTAPS);

  // Return read buffer (it has been copied into tmp_)
  qin->pushRead(std::move(input));

  // Do actual work
  std::complex<float>* fi = tmp_.data();
  std::complex<float>* fo = output->data();
  work(nsamples, fi, fo);

  // Keep final NTAPS samples around
  tmp_.erase(tmp_.begin(), tmp_.end() - NTAPS);
  ASSERT(tmp_.size() == NTAPS);

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}